

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_inv_mod(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *N)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi *B;
  mbedtls_mpi *X_00;
  mbedtls_mpi V1;
  mbedtls_mpi TU;
  mbedtls_mpi TV;
  mbedtls_mpi V2;
  mbedtls_mpi U2;
  mbedtls_mpi U1;
  mbedtls_mpi TA;
  mbedtls_mpi TB;
  mbedtls_mpi Y;
  mbedtls_mpi G;
  mbedtls_mpi_uint p_1 [1];
  mbedtls_mpi local_d8;
  mbedtls_mpi local_c8;
  mbedtls_mpi local_b8;
  mbedtls_mpi local_a8;
  mbedtls_mpi local_98;
  mbedtls_mpi local_88;
  mbedtls_mpi local_78;
  mbedtls_mpi local_68;
  mbedtls_mpi local_58;
  mbedtls_mpi local_48;
  mbedtls_mpi_uint *local_38;
  
  local_58.p = (mbedtls_mpi_uint *)&local_48;
  local_48.p = (mbedtls_mpi_uint *)0x1;
  local_58.s = 1;
  local_58.n = 1;
  iVar1 = mbedtls_mpi_cmp_mpi(N,&local_58);
  if (iVar1 < 1) {
    return -4;
  }
  local_78.s = 1;
  local_78.n = 0;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  local_88.s = 1;
  local_88.n = 0;
  local_88.p = (mbedtls_mpi_uint *)0x0;
  local_98.s = 1;
  local_98.n = 0;
  local_98.p = (mbedtls_mpi_uint *)0x0;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  local_68.s = 1;
  local_68.n = 0;
  local_68.p = (mbedtls_mpi_uint *)0x0;
  local_b8.s = 1;
  local_b8.n = 0;
  local_b8.p = (mbedtls_mpi_uint *)0x0;
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  local_a8.s = 1;
  local_a8.n = 0;
  local_a8.p = (mbedtls_mpi_uint *)0x0;
  iVar1 = mbedtls_mpi_gcd(&local_48,A,N);
  if (iVar1 == 0) {
    local_38 = (mbedtls_mpi_uint *)0x1;
    local_58.s = 1;
    local_58.n = 1;
    local_58.p = (mbedtls_mpi_uint *)&local_38;
    iVar2 = mbedtls_mpi_cmp_mpi(&local_48,&local_58);
    iVar1 = -0xe;
    if ((((((iVar2 == 0) && (iVar1 = mbedtls_mpi_mod_mpi(&local_78,A,N), iVar1 == 0)) &&
          (iVar1 = mbedtls_mpi_copy(&local_c8,&local_78), iVar1 == 0)) &&
         ((iVar1 = mbedtls_mpi_copy(&local_68,N), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_copy(&local_b8,N), iVar1 == 0)))) &&
        ((iVar1 = mbedtls_mpi_lset(&local_88,1), iVar1 == 0 &&
         ((iVar1 = mbedtls_mpi_lset(&local_98,0), iVar1 == 0 &&
          (iVar1 = mbedtls_mpi_lset(&local_d8,0), iVar1 == 0)))))) &&
       (iVar1 = mbedtls_mpi_lset(&local_a8,1), iVar1 == 0)) {
      do {
        while ((*local_c8.p & 1) == 0) {
          if ((ulong)local_c8.n != 0) {
            mbedtls_mpi_core_shift_r(local_c8.p,(ulong)local_c8.n,1);
          }
          if ((((*local_88.p & 1) != 0) || ((*local_98.p & 1) != 0)) &&
             ((iVar1 = add_sub_mpi(&local_88,&local_88,&local_68,1), iVar1 != 0 ||
              (iVar1 = add_sub_mpi(&local_98,&local_98,&local_78,-1), iVar1 != 0))))
          goto LAB_0034a9e6;
          if ((ulong)local_88.n != 0) {
            mbedtls_mpi_core_shift_r(local_88.p,(ulong)local_88.n,1);
          }
          if ((ulong)local_98.n != 0) {
            mbedtls_mpi_core_shift_r(local_98.p,(ulong)local_98.n,1);
          }
        }
        while ((*local_b8.p & 1) == 0) {
          if ((ulong)local_b8.n != 0) {
            mbedtls_mpi_core_shift_r(local_b8.p,(ulong)local_b8.n,1);
          }
          if ((((*local_d8.p & 1) != 0) || ((*local_a8.p & 1) != 0)) &&
             ((iVar1 = add_sub_mpi(&local_d8,&local_d8,&local_68,1), iVar1 != 0 ||
              (iVar1 = add_sub_mpi(&local_a8,&local_a8,&local_78,-1), iVar1 != 0))))
          goto LAB_0034a9e6;
          if ((ulong)local_d8.n != 0) {
            mbedtls_mpi_core_shift_r(local_d8.p,(ulong)local_d8.n,1);
          }
          if ((ulong)local_a8.n != 0) {
            mbedtls_mpi_core_shift_r(local_a8.p,(ulong)local_a8.n,1);
          }
        }
        iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_b8);
        if (iVar1 < 0) {
          iVar1 = add_sub_mpi(&local_b8,&local_b8,&local_c8,-1);
          if ((iVar1 != 0) || (iVar1 = add_sub_mpi(&local_d8,&local_d8,&local_88,-1), iVar1 != 0))
          goto LAB_0034a9e6;
          X_00 = &local_a8;
          B = &local_98;
        }
        else {
          iVar1 = add_sub_mpi(&local_c8,&local_c8,&local_b8,-1);
          if ((iVar1 != 0) || (iVar1 = add_sub_mpi(&local_88,&local_88,&local_d8,-1), iVar1 != 0))
          goto LAB_0034a9e6;
          B = &local_a8;
          X_00 = &local_98;
        }
        iVar1 = add_sub_mpi(X_00,X_00,B,-1);
        if (iVar1 != 0) goto LAB_0034a9e6;
        local_38 = (mbedtls_mpi_uint *)0x0;
        local_58.s = 1;
        local_58.n = 1;
        local_58.p = (mbedtls_mpi_uint *)&local_38;
        iVar1 = mbedtls_mpi_cmp_mpi(&local_c8,&local_58);
      } while (iVar1 != 0);
      do {
        local_38 = (mbedtls_mpi_uint *)0x0;
        local_58.s = 1;
        local_58.n = 1;
        local_58.p = (mbedtls_mpi_uint *)&local_38;
        iVar1 = mbedtls_mpi_cmp_mpi(&local_d8,&local_58);
        if (-1 < iVar1) goto LAB_0034aea3;
        iVar1 = add_sub_mpi(&local_d8,&local_d8,N,1);
      } while (iVar1 == 0);
    }
  }
  goto LAB_0034a9e6;
  while (iVar1 = add_sub_mpi(&local_d8,&local_d8,N,-1), iVar1 == 0) {
LAB_0034aea3:
    iVar1 = mbedtls_mpi_cmp_mpi(&local_d8,N);
    if (iVar1 < 0) {
      iVar1 = mbedtls_mpi_copy(X,&local_d8);
      break;
    }
  }
LAB_0034a9e6:
  if (local_78.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_78.p,(ulong)local_78.n << 3);
  }
  local_78.s = 1;
  local_78.n = 0;
  local_78.p = (mbedtls_mpi_uint *)0x0;
  if (local_c8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_c8.p,(ulong)local_c8.n << 3);
  }
  local_c8.s = 1;
  local_c8.n = 0;
  local_c8.p = (mbedtls_mpi_uint *)0x0;
  if (local_88.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_88.p,(ulong)local_88.n << 3);
  }
  local_88.s = 1;
  local_88.n = 0;
  local_88.p = (mbedtls_mpi_uint *)0x0;
  if (local_98.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_98.p,(ulong)local_98.n << 3);
  }
  local_98.s = 1;
  local_98.n = 0;
  local_98.p = (mbedtls_mpi_uint *)0x0;
  if (local_48.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_48.p,(ulong)local_48.n << 3);
  }
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  if (local_68.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_68.p,(ulong)local_68.n << 3);
  }
  local_68.s = 1;
  local_68.n = 0;
  local_68.p = (mbedtls_mpi_uint *)0x0;
  if (local_b8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_b8.p,(ulong)local_b8.n << 3);
  }
  local_b8.s = 1;
  local_b8.n = 0;
  local_b8.p = (mbedtls_mpi_uint *)0x0;
  if (local_d8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_d8.p,(ulong)local_d8.n << 3);
  }
  local_d8.s = 1;
  local_d8.n = 0;
  local_d8.p = (mbedtls_mpi_uint *)0x0;
  if (local_a8.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_a8.p,(ulong)local_a8.n << 3);
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_inv_mod(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *N)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi G, TA, TU, U1, U2, TB, TV, V1, V2;

    if (mbedtls_mpi_cmp_int(N, 1) <= 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&TA); mbedtls_mpi_init(&TU); mbedtls_mpi_init(&U1); mbedtls_mpi_init(&U2);
    mbedtls_mpi_init(&G); mbedtls_mpi_init(&TB); mbedtls_mpi_init(&TV);
    mbedtls_mpi_init(&V1); mbedtls_mpi_init(&V2);

    MBEDTLS_MPI_CHK(mbedtls_mpi_gcd(&G, A, N));

    if (mbedtls_mpi_cmp_int(&G, 1) != 0) {
        ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&TA, A, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TU, &TA));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TB, N));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&TV, N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&U1, 1));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&U2, 0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&V1, 0));
    MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&V2, 1));

    do {
        while ((TU.p[0] & 1) == 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TU, 1));

            if ((U1.p[0] & 1) != 0 || (U2.p[0] & 1) != 0) {
                MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&U1, &U1, &TB));
                MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U2, &U2, &TA));
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&U1, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&U2, 1));
        }

        while ((TV.p[0] & 1) == 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&TV, 1));

            if ((V1.p[0] & 1) != 0 || (V2.p[0] & 1) != 0) {
                MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&V1, &V1, &TB));
                MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V2, &V2, &TA));
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&V1, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&V2, 1));
        }

        if (mbedtls_mpi_cmp_mpi(&TU, &TV) >= 0) {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&TU, &TU, &TV));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U1, &U1, &V1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&U2, &U2, &V2));
        } else {
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&TV, &TV, &TU));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V1, &V1, &U1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V2, &V2, &U2));
        }
    } while (mbedtls_mpi_cmp_int(&TU, 0) != 0);

    while (mbedtls_mpi_cmp_int(&V1, 0) < 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_add_mpi(&V1, &V1, N));
    }

    while (mbedtls_mpi_cmp_mpi(&V1, N) >= 0) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_sub_mpi(&V1, &V1, N));
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(X, &V1));

cleanup:

    mbedtls_mpi_free(&TA); mbedtls_mpi_free(&TU); mbedtls_mpi_free(&U1); mbedtls_mpi_free(&U2);
    mbedtls_mpi_free(&G); mbedtls_mpi_free(&TB); mbedtls_mpi_free(&TV);
    mbedtls_mpi_free(&V1); mbedtls_mpi_free(&V2);

    return ret;
}